

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::prepend_move(xml_node *this,xml_node *moved)

{
  bool bVar1;
  xml_node *moved_local;
  xml_node *this_local;
  
  bVar1 = impl::anon_unknown_0::allow_move(this,moved);
  if (bVar1) {
    impl::anon_unknown_0::remove_node(moved->_root);
    impl::anon_unknown_0::prepend_node(moved->_root,this->_root);
    this_local = (xml_node *)moved->_root;
  }
  else {
    xml_node((xml_node *)&this_local);
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI__FN xml_node xml_node::prepend_move(const xml_node& moved)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();

		impl::remove_node(moved._root);
		impl::prepend_node(moved._root, _root);

		return moved;
	}